

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

HelicsCore helicsCoreClone(HelicsCore core,HelicsError *err)

{
  CoreObject *pCVar1;
  _Head_base<0UL,_helics::CoreObject_*,_false> _Var2;
  __single_object coreClone;
  _Head_base<0UL,_helics::CoreObject_*,_false> local_30;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_28;
  MasterObjectHolder *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  pCVar1 = helics::getCoreObject(core,err);
  if (pCVar1 == (CoreObject *)0x0) {
    _Var2._M_head_impl = (CoreObject *)0x0;
  }
  else {
    std::make_unique<helics::CoreObject>();
    (local_30._M_head_impl)->valid = 0x378424ec;
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)local_30._M_head_impl,
               (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)pCVar1);
    _Var2._M_head_impl = local_30._M_head_impl;
    getMasterHolder();
    local_28._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         local_30._M_head_impl;
    local_30._M_head_impl = (CoreObject *)0x0;
    MasterObjectHolder::addCore
              (local_20,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        &local_28);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_28
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_30
              );
  }
  return _Var2._M_head_impl;
}

Assistant:

HelicsCore helicsCoreClone(HelicsCore core, HelicsError* err)
{
    auto* coreObj = helics::getCoreObject(core, err);
    if (coreObj == nullptr) {
        return nullptr;
    }
    try {
        auto coreClone = std::make_unique<helics::CoreObject>();
        coreClone->valid = gCoreValidationIdentifier;
        coreClone->coreptr = coreObj->coreptr;
        auto* retcore = reinterpret_cast<HelicsCore>(coreClone.get());
        getMasterHolder()->addCore(std::move(coreClone));

        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}